

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Capturer::Capturer
          (Capturer *this,StringRef macroName,SourceLineInfo *lineInfo,OfType resultType,
          StringRef names)

{
  Capturer *pCVar1;
  pointer *ppMVar2;
  int iVar3;
  IResultCapture *pIVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  stack<char,_std::deque<char,_std::allocator<char>_>_> openings;
  byte local_fd;
  OfType local_fc;
  Capturer *local_f8;
  SourceLineInfo *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  pointer *local_c8;
  char *local_c0;
  StringRef local_b8;
  _Deque_base<char,_std::allocator<char>_> local_a8;
  ReusableStringStream local_58;
  SourceLineInfo local_40;
  
  local_b8.m_size = macroName.m_size;
  local_b8.m_start = macroName.m_start;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_fc = resultType;
  local_f0 = lineInfo;
  pIVar4 = getResultCapture();
  this->m_resultCapture = pIVar4;
  this->m_captured = 0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  clara::std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map(&local_a8,0);
  local_f8 = this;
  if (names.m_size == 0) {
    uVar9 = 0;
  }
  else {
    local_c8 = &(this->m_messages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_finish;
    uVar5 = 0;
    uVar9 = 0;
    do {
      local_fd = names.m_start[uVar5];
      if (local_fd < 0x5b) {
        switch(local_fd) {
        case 0x22:
        case 0x27:
          uVar10 = uVar5 + 1;
          if (names.m_size <= uVar10) {
LAB_0012b35e:
            ReusableStringStream::ReusableStringStream(&local_58);
            local_40.file =
                 "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/catch.hpp"
            ;
            local_40.line = 0x2e6b;
            operator<<(local_58.m_oss,&local_40);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_58.m_oss,": Internal Catch2 error: ",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_58.m_oss,"CAPTURE parsing encountered unmatched quote",0x2b)
            ;
            std::__cxx11::stringbuf::str();
            throw_logic_error(&local_e8);
          }
          bVar11 = true;
          bVar7 = names.m_start[uVar10];
          while (bVar7 != local_fd) {
            uVar6 = uVar10;
            if (bVar7 == 0x5c) {
              uVar6 = uVar5 + 2;
            }
            uVar10 = uVar6 + 1;
            bVar11 = uVar10 < names.m_size;
            if (!bVar11) goto LAB_0012b35e;
            uVar5 = uVar6;
            bVar7 = names.m_start[uVar10];
          }
          uVar5 = uVar10;
          if (!bVar11) goto LAB_0012b35e;
          break;
        case 0x28:
          goto switchD_0012b153_caseD_28;
        case 0x29:
          goto switchD_0012b153_caseD_29;
        case 0x2c:
          if ((uVar9 != uVar5) &&
             (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_a8._M_impl.super__Deque_impl_data._M_start._M_cur)) {
            std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
            emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
                      ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)this,
                       &local_b8,local_f0,&local_fc);
            if (names.m_size <= uVar9) goto LAB_0012b071;
            uVar10 = (uVar5 - uVar9) + 1;
            while (((byte)names.m_start[uVar9] == 0x2c ||
                   (iVar3 = isspace((uint)(byte)names.m_start[uVar9]), iVar3 != 0))) {
              uVar9 = uVar9 + 1;
              uVar10 = uVar10 - 1;
              if (uVar9 == names.m_size) goto LAB_0012b071;
            }
            local_c0 = names.m_start + uVar9;
            uVar6 = uVar5;
            while (((byte)names.m_start[uVar6] == 0x2c ||
                   (iVar3 = isspace((uint)(byte)names.m_start[uVar6]), iVar3 != 0))) {
              uVar6 = uVar6 - 1;
              uVar10 = uVar10 - 1;
              if (names.m_size <= uVar6) goto LAB_0012b071;
            }
            uVar6 = names.m_size - uVar9;
            if (uVar10 <= names.m_size - uVar9) {
              uVar6 = uVar10;
            }
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e8,local_c0,local_c0 + uVar6);
            ppMVar2 = local_c8;
            Catch::Capturer();
            this = local_f8;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &(*ppMVar2)[-1].message," := ");
            uVar9 = uVar5;
          }
        }
      }
      else {
        if (local_fd < 0x7b) {
          if (local_fd != 0x5b) {
            if (local_fd != 0x5d) goto switchD_0012b153_caseD_23;
switchD_0012b153_caseD_29:
            if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_a8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   (_Elt_pointer)
                   ((byte *)local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x200);
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   (_Elt_pointer)
                   ((byte *)local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1ff);
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_a8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            goto switchD_0012b153_caseD_23;
          }
        }
        else {
          if (local_fd == 0x7d) goto switchD_0012b153_caseD_29;
          if (local_fd != 0x7b) goto switchD_0012b153_caseD_23;
        }
switchD_0012b153_caseD_28:
        if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<char,std::allocator<char>>::_M_push_back_aux<char_const&>
                    ((deque<char,std::allocator<char>> *)&local_a8,(char *)&local_fd);
        }
        else {
          *local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_fd;
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
switchD_0012b153_caseD_23:
      uVar5 = uVar5 + 1;
    } while (uVar5 < names.m_size);
  }
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    __assert_fail("openings.empty() && \"Mismatched openings\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/catch.hpp"
                  ,0x2e8e,
                  "Catch::Capturer::Capturer(StringRef, const SourceLineInfo &, ResultWas::OfType, StringRef)"
                 );
  }
  std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
  emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
            ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)this,&local_b8,
             local_f0,&local_fc);
  uVar5 = names.m_size - uVar9;
  if (uVar9 <= names.m_size && uVar5 != 0) {
    uVar10 = names.m_size - 1;
    pbVar8 = (byte *)(names.m_start + uVar9);
    do {
      if ((*pbVar8 != 0x2c) && (iVar3 = isspace((uint)*pbVar8), uVar9 = uVar5, iVar3 == 0))
      goto LAB_0012b052;
      pbVar8 = pbVar8 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
LAB_0012b071:
  __assert_fail("index < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/catch.hpp"
                ,0x283,"char Catch::StringRef::operator[](size_type) const");
LAB_0012b052:
  do {
    if (((byte)names.m_start[uVar10] != 0x2c) &&
       (iVar3 = isspace((uint)(byte)names.m_start[uVar10]), iVar3 == 0)) {
      if (uVar5 < uVar9) {
        uVar9 = uVar5;
      }
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,pbVar8,pbVar8 + uVar9);
      pCVar1 = local_f8;
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(&(local_f8->m_messages).
                 super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl
                 .super__Vector_impl_data._M_finish[-1].message,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(pCVar1->m_messages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].message," := ");
      clara::std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_a8);
      return;
    }
    uVar10 = uVar10 - 1;
    uVar9 = uVar9 - 1;
  } while (uVar10 < names.m_size);
  goto LAB_0012b071;
}

Assistant:

Capturer::Capturer( StringRef macroName, SourceLineInfo const& lineInfo, ResultWas::OfType resultType, StringRef names ) {
        auto trimmed = [&] (size_t start, size_t end) {
            while (names[start] == ',' || isspace(static_cast<unsigned char>(names[start]))) {
                ++start;
            }
            while (names[end] == ',' || isspace(static_cast<unsigned char>(names[end]))) {
                --end;
            }
            return names.substr(start, end - start + 1);
        };
        auto skipq = [&] (size_t start, char quote) {
            for (auto i = start + 1; i < names.size() ; ++i) {
                if (names[i] == quote)
                    return i;
                if (names[i] == '\\')
                    ++i;
            }
            CATCH_INTERNAL_ERROR("CAPTURE parsing encountered unmatched quote");
        };

        size_t start = 0;
        std::stack<char> openings;
        for (size_t pos = 0; pos < names.size(); ++pos) {
            char c = names[pos];
            switch (c) {
            case '[':
            case '{':
            case '(':
            // It is basically impossible to disambiguate between
            // comparison and start of template args in this context
//            case '<':
                openings.push(c);
                break;
            case ']':
            case '}':
            case ')':
//           case '>':
                openings.pop();
                break;
            case '"':
            case '\'':
                pos = skipq(pos, c);
                break;
            case ',':
                if (start != pos && openings.empty()) {
                    m_messages.emplace_back(macroName, lineInfo, resultType);
                    m_messages.back().message = static_cast<std::string>(trimmed(start, pos));
                    m_messages.back().message += " := ";
                    start = pos;
                }
            }
        }
        assert(openings.empty() && "Mismatched openings");
        m_messages.emplace_back(macroName, lineInfo, resultType);
        m_messages.back().message = static_cast<std::string>(trimmed(start, names.size() - 1));
        m_messages.back().message += " := ";
    }